

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O3

size_t req_stream_size(rtr_bgpsec *data,align_type type)

{
  int iVar1;
  int iVar2;
  rtr_signature_seg *prVar3;
  long in_FS_OFFSET;
  
  prVar3 = data->sigs;
  iVar1 = 9;
  if ((prVar3 != (rtr_signature_seg *)0x0) &&
     ((type != VALIDATION || (prVar3 = prVar3->next, prVar3 != (rtr_signature_seg *)0x0)))) {
    iVar2 = 0;
    do {
      iVar1 = iVar2 + (uint)prVar3->sig_len;
      iVar2 = iVar1 + 0x16;
      prVar3 = prVar3->next;
    } while (prVar3 != (rtr_signature_seg *)0x0);
    iVar1 = iVar1 + 0x1f;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (ulong)(iVar1 + (data->nlri->nlri_len + 7 >> 3) +
                  ((uint)data->path_len + (uint)data->path_len * 2) * 2);
  }
  __stack_chk_fail();
}

Assistant:

size_t req_stream_size(const struct rtr_bgpsec *data, enum align_type type)
{
	unsigned int sig_segs_size = get_sig_seg_size(data->sigs, type);
	uint8_t nlri_len_b = (data->nlri->nlri_len + 7) / 8; // bits to bytes
	unsigned int bytes_len = 9 // alg(1) + afi(2) + safi(1) + asn(4) + prefix_len(1)
				 + nlri_len_b + sig_segs_size + (SECURE_PATH_SEG_SIZE * data->path_len);
	return bytes_len;
}